

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::LimitCheckNumVars
          (ValidationState_t *_,uint32_t var_id,StorageClass storage_class)

{
  spv_const_validator_options psVar1;
  size_t sVar2;
  DiagnosticStream *pDVar3;
  DiagnosticStream local_3e0;
  uint local_204;
  undefined1 local_200 [4];
  uint32_t num_global_vars_limit;
  uint local_24;
  StorageClass local_20;
  uint32_t num_local_vars_limit;
  StorageClass storage_class_local;
  uint32_t var_id_local;
  ValidationState_t *__local;
  
  local_20 = storage_class;
  num_local_vars_limit = var_id;
  _storage_class_local = _;
  if (storage_class == Function) {
    ValidationState_t::registerLocalVariable(_,var_id);
    psVar1 = ValidationState_t::options(_storage_class_local);
    local_24 = (psVar1->universal_limits_).max_local_variables;
    sVar2 = ValidationState_t::num_local_vars(_storage_class_local);
    if (local_24 < sVar2) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_200,_storage_class_local,SPV_ERROR_INVALID_BINARY,
                 (Instruction *)0x0);
      pDVar3 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_200,
                          (char (*) [80])
                          "Number of local variables (\'Function\' Storage Class) exceeded the valid limit ("
                         );
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_24);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [3])0x5b79e4);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_200);
      return __local._4_4_;
    }
  }
  else {
    ValidationState_t::registerGlobalVariable(_,var_id);
    psVar1 = ValidationState_t::options(_storage_class_local);
    local_204 = (psVar1->universal_limits_).max_global_variables;
    sVar2 = ValidationState_t::num_global_vars(_storage_class_local);
    if (local_204 < sVar2) {
      ValidationState_t::diag
                (&local_3e0,_storage_class_local,SPV_ERROR_INVALID_BINARY,(Instruction *)0x0);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_3e0,
                          (char (*) [92])
                          "Number of Global Variables (Storage Class other than \'Function\') exceeded the valid limit ("
                         );
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_204);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [3])0x5b79e4);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_3e0);
      return __local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t LimitCheckNumVars(ValidationState_t& _, const uint32_t var_id,
                               const spv::StorageClass storage_class) {
  if (spv::StorageClass::Function == storage_class) {
    _.registerLocalVariable(var_id);
    const uint32_t num_local_vars_limit =
        _.options()->universal_limits_.max_local_variables;
    if (_.num_local_vars() > num_local_vars_limit) {
      return _.diag(SPV_ERROR_INVALID_BINARY, nullptr)
             << "Number of local variables ('Function' Storage Class) "
                "exceeded the valid limit ("
             << num_local_vars_limit << ").";
    }
  } else {
    _.registerGlobalVariable(var_id);
    const uint32_t num_global_vars_limit =
        _.options()->universal_limits_.max_global_variables;
    if (_.num_global_vars() > num_global_vars_limit) {
      return _.diag(SPV_ERROR_INVALID_BINARY, nullptr)
             << "Number of Global Variables (Storage Class other than "
                "'Function') exceeded the valid limit ("
             << num_global_vars_limit << ").";
    }
  }
  return SPV_SUCCESS;
}